

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O3

void libxml_domnode_tim_sort_merge
               (xmlNodePtr *dst,TIM_SORT_RUN_T *stack,int stack_curr,TEMP_STORAGE_T *store)

{
  xmlNodePtr *__src;
  ulong uVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr pxVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  xmlNodePtr *__ptr;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long *__size;
  void *pvVar11;
  ulong uVar12;
  
  lVar7 = (long)stack_curr;
  uVar10 = stack[lVar7 + -2].length;
  uVar8 = stack[lVar7 + -1].length;
  uVar9 = uVar8;
  if (uVar10 < uVar8) {
    uVar9 = uVar10;
  }
  uVar12 = stack[lVar7 + -2].start;
  __ptr = store->storage;
  if (store->alloc < uVar9) {
    __size = (long *)(uVar9 * 8);
    __ptr = (xmlNodePtr *)realloc(__ptr,(size_t)__size);
    if (__ptr == (xmlNodePtr *)0x0) {
      libxml_domnode_tim_sort_merge_cold_1();
      if (0 < (int)__size[1]) {
        lVar7 = 0;
        do {
          pvVar5 = *(void **)(*__size + lVar7 * 8);
          pvVar11 = *(void **)((long)pvVar5 + 8);
          if (pvVar11 != (void *)0x0) {
            if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
              (*xmlFree)(*(void **)((long)pvVar11 + 8));
              pvVar11 = *(void **)((long)pvVar5 + 8);
            }
            (*xmlFree)(pvVar11);
          }
          (*xmlFree)(pvVar5);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)__size[1]);
      }
      if ((void *)*__size != (void *)0x0) {
        (*xmlFree)((void *)*__size);
      }
      (*xmlFree)(__size);
      return;
    }
    store->storage = __ptr;
    store->alloc = uVar9;
  }
  if (uVar10 < uVar8) {
    __src = dst + uVar12;
    memcpy(__ptr,__src,uVar10 * 8);
    uVar9 = uVar12 + uVar10;
    uVar1 = uVar9 + uVar8;
    if (uVar12 < uVar1) {
      lVar7 = 0;
      uVar12 = 0;
      do {
        if ((uVar12 < uVar10) && (uVar9 < uVar1)) {
          pxVar3 = __ptr[uVar12];
          pxVar4 = dst[uVar9];
          iVar6 = xmlXPathCmpNodesExt(pxVar3,pxVar4);
          if (iVar6 == -2 || -1 < iVar6) {
            uVar12 = uVar12 + 1;
            __src[lVar7] = pxVar3;
          }
          else {
            uVar9 = uVar9 + 1;
            __src[lVar7] = pxVar4;
          }
        }
        else {
          if (uVar10 <= uVar12) {
            return;
          }
          ppxVar2 = __ptr + uVar12;
          uVar12 = uVar12 + 1;
          __src[lVar7] = *ppxVar2;
        }
        lVar7 = lVar7 + 1;
      } while (uVar8 + uVar10 != lVar7);
    }
  }
  else {
    uVar10 = uVar10 + uVar12;
    memcpy(__ptr,dst + uVar10,uVar8 * 8);
    uVar9 = uVar8 + uVar10;
    while (uVar12 < uVar9) {
      uVar9 = uVar9 - 1;
      if ((uVar8 == 0) || (uVar10 <= uVar12)) {
        if (uVar8 == 0) {
          return;
        }
        lVar7 = uVar8 - 1;
        uVar8 = uVar8 - 1;
        dst[uVar9] = __ptr[lVar7];
      }
      else {
        pxVar3 = dst[uVar10 - 1];
        pxVar4 = __ptr[uVar8 - 1];
        iVar6 = xmlXPathCmpNodesExt(pxVar3,pxVar4);
        if (iVar6 < 0 && iVar6 != -2) {
          uVar10 = uVar10 - 1;
          dst[uVar9] = pxVar3;
        }
        else {
          uVar8 = uVar8 - 1;
          dst[uVar9] = pxVar4;
        }
      }
    }
  }
  return;
}

Assistant:

static void TIM_SORT_MERGE(SORT_TYPE *dst, const TIM_SORT_RUN_T *stack, const int stack_curr,
                           TEMP_STORAGE_T *store) {
  const size_t A = stack[stack_curr - 2].length;
  const size_t B = stack[stack_curr - 1].length;
  const size_t curr = stack[stack_curr - 2].start;
  SORT_TYPE *storage;
  size_t i, j, k;
  TIM_SORT_RESIZE(store, MIN(A, B));
  storage = store->storage;

  /* left merge */
  if (A < B) {
    memcpy(storage, &dst[curr], A * sizeof(SORT_TYPE));
    i = 0;
    j = curr + A;

    for (k = curr; k < curr + A + B; k++) {
      if ((i < A) && (j < curr + A + B)) {
        if (SORT_CMP(storage[i], dst[j]) <= 0) {
          dst[k] = storage[i++];
        } else {
          dst[k] = dst[j++];
        }
      } else if (i < A) {
        dst[k] = storage[i++];
      } else {
        break;
      }
    }
  } else {
    /* right merge */
    memcpy(storage, &dst[curr + A], B * sizeof(SORT_TYPE));
    i = B;
    j = curr + A;
    k = curr + A + B;

    while (k > curr) {
      k--;
      if ((i > 0) && (j > curr)) {
        if (SORT_CMP(dst[j - 1], storage[i - 1]) > 0) {
          dst[k] = dst[--j];
        } else {
          dst[k] = storage[--i];
        }
      } else if (i > 0) {
        dst[k] = storage[--i];
      } else {
        break;
      }
    }
  }
}